

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

EGLConfig eglu::chooseConfigByID(Library *egl,EGLDisplay display,EGLint id)

{
  mapped_type_conflict *pmVar1;
  EGLConfig pvVar2;
  AttribMap attribs;
  key_type_conflict local_4c;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_48;
  
  local_48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48._M_impl.super__Rb_tree_header._M_header;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4c = 0x3028;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_48,&local_4c);
  *pmVar1 = id;
  local_4c = 0x3034;
  pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_48,&local_4c);
  *pmVar1 = -1;
  local_4c = 0x303f;
  pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_48,&local_4c);
  *pmVar1 = -1;
  local_4c = 0x3040;
  pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_48,&local_4c);
  *pmVar1 = -1;
  local_4c = 0x3033;
  pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_48,&local_4c);
  *pmVar1 = -1;
  pvVar2 = chooseSingleConfig(egl,display,(AttribMap *)&local_48);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_48);
  return pvVar2;
}

Assistant:

EGLConfig chooseConfigByID (const Library& egl, EGLDisplay display, EGLint id)
{
	AttribMap attribs;

	attribs[EGL_CONFIG_ID]			= id;
	attribs[EGL_TRANSPARENT_TYPE]	= EGL_DONT_CARE;
	attribs[EGL_COLOR_BUFFER_TYPE]	= EGL_DONT_CARE;
	attribs[EGL_RENDERABLE_TYPE]	= EGL_DONT_CARE;
	attribs[EGL_SURFACE_TYPE]		= EGL_DONT_CARE;

	return chooseSingleConfig(egl, display, attribs);
}